

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtariST.cpp
# Opt level: O2

void __thiscall Atari::ST::ConcreteMachine::insert_media(ConcreteMachine *this)

{
  Media *in_RSI;
  
  insert_media((ConcreteMachine *)(this[-1].memory_map_ + 0xcb),in_RSI);
  return;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			size_t c = 0;
			for(const auto &disk: media.disks) {
				dma_->set_floppy_disk(disk, c);
				++c;
				if(c == 2) break;
			}
			return true;
		}